

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItemSimilarityRecommenderCommon.cpp
# Opt level: O3

shared_ptr<CoreML::Recommender::_ItemSimilarityRecommenderData> __thiscall
CoreML::Recommender::constructAndValidateItemSimilarityRecommenderFromSpec
          (Recommender *this,Model *spec)

{
  void *pvVar1;
  element_type *peVar2;
  bool bVar3;
  invalid_argument *piVar4;
  string *psVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  long lVar7;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  *in_R8;
  ModelDescription *pMVar8;
  long *plVar9;
  shared_ptr<CoreML::Recommender::_ItemSimilarityRecommenderData> sVar10;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_00;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_01;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_02;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_03;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  allowed_item_input_types;
  Result result;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  allowed_item_input_types_1;
  ItemSimilarityRecommender isr;
  allocator_type local_169;
  undefined1 local_168 [8];
  _Alloc_hider local_160;
  undefined1 local_158 [24];
  TypeCase *local_140;
  _Alloc_hider local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  undefined1 local_118 [24];
  undefined1 local_100 [8];
  undefined4 local_f8;
  undefined4 uStack_f4;
  TypeCase local_f0 [2];
  undefined1 local_e8 [8];
  long local_e0 [4];
  CoreML *local_c0;
  Recommender *local_b8;
  ModelDescription *local_b0;
  element_type *local_a8;
  ItemSimilarityRecommender local_a0;
  
  pMVar8 = spec->description_;
  if (pMVar8 == (ModelDescription *)0x0) {
    pMVar8 = (ModelDescription *)&Specification::_ModelDescription_default_instance_;
  }
  validateModelDescription((Result *)&local_140,pMVar8,spec->specificationversion_);
  bVar3 = Result::good((Result *)&local_140);
  if (!bVar3) {
    piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
    psVar5 = Result::message_abi_cxx11_((Result *)&local_140);
    std::invalid_argument::invalid_argument(piVar4,(string *)psVar5);
LAB_00518bf5:
    __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  if (spec->_oneof_case_[0] != 0x1f5) {
    piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
    psVar5 = Result::message_abi_cxx11_((Result *)&local_140);
    std::invalid_argument::invalid_argument(piVar4,(string *)psVar5);
    goto LAB_00518bf5;
  }
  Specification::ItemSimilarityRecommender::ItemSimilarityRecommender
            (&local_a0,(spec->Type_).itemsimilarityrecommender_);
  *(undefined8 *)this = 0;
  local_b8 = this + 8;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<CoreML::Recommender::_ItemSimilarityRecommenderData,std::allocator<CoreML::Recommender::_ItemSimilarityRecommenderData>,CoreML::Specification::ItemSimilarityRecommender&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_b8,
             (_ItemSimilarityRecommenderData **)this,
             (allocator<CoreML::Recommender::_ItemSimilarityRecommenderData> *)local_100,&local_a0);
  if (*(long *)(*(long *)this + 0xd0) == 0) {
    if ((pMVar8->input_).super_RepeatedPtrFieldBase.current_size_ != 1) {
      piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument
                (piVar4,"Name of column for item input data not specified.");
      goto LAB_00518cce;
    }
    std::__cxx11::string::_M_assign((string *)(*(long *)this + 200));
  }
  local_100 = (undefined1  [8])0x700000006;
  local_f8 = 5;
  __l._M_len = 3;
  __l._M_array = (iterator)local_100;
  std::
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  ::vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
            *)local_168,__l,(allocator_type *)local_118);
  local_c0 = (CoreML *)&pMVar8->input_;
  validateDescriptionsContainFeatureWithNameAndType<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
            ((Result *)local_100,local_c0,
             (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)(*(long *)this + 200),
             (string *)local_168,in_R8);
  local_140 = (TypeCase *)local_100;
  std::__cxx11::string::operator=((string *)&local_138,(string *)&local_f8);
  if ((undefined1 *)CONCAT44(uStack_f4,local_f8) != local_e8) {
    operator_delete((undefined1 *)CONCAT44(uStack_f4,local_f8),(long)local_e8 + 1);
  }
  bVar3 = Result::good((Result *)&local_140);
  if (!bVar3) {
    piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
    psVar5 = Result::message_abi_cxx11_((Result *)&local_140);
    std::invalid_argument::invalid_argument(piVar4,(string *)psVar5);
    __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  if (local_168 != (undefined1  [8])0x0) {
    operator_delete((void *)local_168,local_158._0_8_ - (long)local_168);
  }
  lVar7 = *(long *)this;
  if (*(long *)(lVar7 + 0x90) != 0) {
    local_118._0_4_ = kInt64Type;
    __l_00._M_len = 1;
    __l_00._M_array = (iterator)local_118;
    std::
    vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
              *)local_168,__l_00,&local_169);
    validateDescriptionsContainFeatureWithNameAndType<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
              ((Result *)local_100,local_c0,
               (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)(lVar7 + 0x88),
               (string *)local_168,in_R8);
    local_140 = (TypeCase *)local_100;
    std::__cxx11::string::operator=((string *)&local_138,(string *)&local_f8);
    if ((undefined1 *)CONCAT44(uStack_f4,local_f8) != local_e8) {
      operator_delete((undefined1 *)CONCAT44(uStack_f4,local_f8),(long)local_e8 + 1);
    }
    if (local_168 != (undefined1  [8])0x0) {
      operator_delete((void *)local_168,local_158._0_8_ - (long)local_168);
    }
    bVar3 = Result::good((Result *)&local_140);
    if (!bVar3) {
      piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
      psVar5 = Result::message_abi_cxx11_((Result *)&local_140);
      std::invalid_argument::invalid_argument(piVar4,(string *)psVar5);
LAB_00518cce:
      __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
  }
  local_100._0_4_ = UNSUPPORTED_COMPATIBILITY_VERSION;
  local_100._4_4_ = MODEL_MAIN_IMAGE_OUTPUT_SIZE_BAD;
  __l_01._M_len = 2;
  __l_01._M_array = (iterator)local_100;
  std::
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  ::vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
            *)local_118,__l_01,(allocator_type *)local_168);
  local_100 = (undefined1  [8])local_f0;
  lVar7 = *(long *)(*(long *)this + 0xa8);
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_100,lVar7,*(long *)(*(long *)this + 0xb0) + lVar7);
  local_e0[0] = (long)(local_e0 + 2);
  lVar7 = *(long *)(*(long *)this + 0x68);
  local_b0 = pMVar8;
  local_a8 = (element_type *)this;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_e0,lVar7,*(long *)(*(long *)this + 0x70) + lVar7);
  lVar7 = 0;
  do {
    if (*(long *)((long)&local_f8 + lVar7) != 0) {
      validateDescriptionsContainFeatureWithNameAndType<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
                ((Result *)local_168,local_c0,
                 (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)(local_100 + lVar7),
                 (string *)local_118,in_R8);
      local_140 = (TypeCase *)local_168;
      std::__cxx11::string::operator=((string *)&local_138,(string *)&local_160);
      if (local_160._M_p != local_158 + 8) {
        operator_delete(local_160._M_p,local_158._8_8_ + 1);
      }
      bVar3 = Result::good((Result *)&local_140);
      if (!bVar3) {
        piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
        psVar5 = Result::message_abi_cxx11_((Result *)&local_140);
        std::invalid_argument::invalid_argument(piVar4,(string *)psVar5);
        __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument
                   );
      }
    }
    peVar2 = local_a8;
    pMVar8 = local_b0;
    lVar7 = lVar7 + 0x20;
  } while (lVar7 != 0x40);
  lVar7 = -0x40;
  plVar9 = local_e0 + 2;
  do {
    if (plVar9 != (long *)plVar9[-2]) {
      operator_delete((long *)plVar9[-2],*plVar9 + 1);
    }
    plVar9 = plVar9 + -4;
    lVar7 = lVar7 + 0x20;
  } while (lVar7 != 0);
  pvVar1 = (void *)CONCAT44(local_118._4_4_,local_118._0_4_);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,local_118._16_8_ - (long)pvVar1);
  }
  lVar7 = *(long *)&(peVar2->item_interactions)._M_t._M_impl;
  if (*(long *)(lVar7 + 0x110) == 0) {
    if (*(long *)(lVar7 + 0xf0) == 0) {
      piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(piVar4,"No output columns specified.");
      goto LAB_00518d00;
    }
  }
  else {
    local_118._0_4_ = kDictionaryType;
    __l_02._M_len = 1;
    __l_02._M_array = (iterator)local_118;
    std::
    vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
              *)local_168,__l_02,&local_169);
    validateDescriptionsContainFeatureWithNameAndType<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
              ((Result *)local_100,(CoreML *)&pMVar8->output_,
               (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)(lVar7 + 0x108),
               (string *)local_168,in_R8);
    local_140 = (TypeCase *)local_100;
    std::__cxx11::string::operator=((string *)&local_138,(string *)&local_f8);
    if ((undefined1 *)CONCAT44(uStack_f4,local_f8) != local_e8) {
      operator_delete((undefined1 *)CONCAT44(uStack_f4,local_f8),(long)local_e8 + 1);
    }
    if (local_168 != (undefined1  [8])0x0) {
      operator_delete((void *)local_168,local_158._0_8_ - (long)local_168);
    }
    bVar3 = Result::good((Result *)&local_140);
    if (!bVar3) {
      piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
      psVar5 = Result::message_abi_cxx11_((Result *)&local_140);
      std::invalid_argument::invalid_argument(piVar4,(string *)psVar5);
      goto LAB_00518d00;
    }
    lVar7 = *(long *)&(peVar2->item_interactions)._M_t._M_impl;
    if (*(long *)(lVar7 + 0xf0) == 0) goto LAB_00518b35;
  }
  local_118._0_4_ = kSequenceType;
  __l_03._M_len = 1;
  __l_03._M_array = (iterator)local_118;
  std::
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  ::vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
            *)local_168,__l_03,&local_169);
  validateDescriptionsContainFeatureWithNameAndType<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
            ((Result *)local_100,(CoreML *)&pMVar8->output_,
             (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)(lVar7 + 0xe8),
             (string *)local_168,in_R8);
  local_140 = (TypeCase *)local_100;
  std::__cxx11::string::operator=((string *)&local_138,(string *)&local_f8);
  if ((undefined1 *)CONCAT44(uStack_f4,local_f8) != local_e8) {
    operator_delete((undefined1 *)CONCAT44(uStack_f4,local_f8),(long)local_e8 + 1);
  }
  if (local_168 != (undefined1  [8])0x0) {
    operator_delete((void *)local_168,local_158._0_8_ - (long)local_168);
  }
  bVar3 = Result::good((Result *)&local_140);
  if (bVar3) {
LAB_00518b35:
    Specification::ItemSimilarityRecommender::~ItemSimilarityRecommender(&local_a0);
    _Var6._M_pi = extraout_RDX;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_p != &local_128) {
      operator_delete(local_138._M_p,local_128._M_allocated_capacity + 1);
      _Var6._M_pi = extraout_RDX_00;
    }
    sVar10.
    super___shared_ptr<CoreML::Recommender::_ItemSimilarityRecommenderData,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = _Var6._M_pi;
    sVar10.
    super___shared_ptr<CoreML::Recommender::_ItemSimilarityRecommenderData,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = peVar2;
    return (shared_ptr<CoreML::Recommender::_ItemSimilarityRecommenderData>)
           sVar10.
           super___shared_ptr<CoreML::Recommender::_ItemSimilarityRecommenderData,_(__gnu_cxx::_Lock_policy)2>
    ;
  }
  piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
  psVar5 = Result::message_abi_cxx11_((Result *)&local_140);
  std::invalid_argument::invalid_argument(piVar4,(string *)psVar5);
LAB_00518d00:
  __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

std::shared_ptr<_ItemSimilarityRecommenderData>
  constructAndValidateItemSimilarityRecommenderFromSpec(const Specification::Model& spec){
    const auto& interface = spec.description();

      // Validate its a MLModel type.
    auto result = validateModelDescription(interface, spec.specificationversion());

    if(!result.good()) {
      throw std::invalid_argument(result.message());
    }

    /** Preliminary. -- get the right tree parameters out to get all the nodes.
     */
    if(!spec.has_itemsimilarityrecommender()) {
      throw std::invalid_argument(result.message());
    }

    auto isr = spec.itemsimilarityrecommender();

    auto ret = std::make_shared<_ItemSimilarityRecommenderData>(isr);

    // Perform validation on the constructed data set

    // Validate the input column
    {
      if(ret->item_data_input_column.empty()) {
        if(interface.input_size() == 1) {
          ret->item_data_input_column = interface.input(0).name();
        } else {
          throw std::invalid_argument("Name of column for item input data not specified.");
        }
      }

      std::vector<Specification::FeatureType::TypeCase> allowed_item_input_types =
      { Specification::FeatureType::kDictionaryType,
        Specification::FeatureType::kSequenceType,
        Specification::FeatureType::kMultiArrayType};

      result = validateDescriptionsContainFeatureWithNameAndType(interface.input(),
                                                                 ret->item_data_input_column,
                                                                 allowed_item_input_types);
      if(!result.good()) {
        throw std::invalid_argument(result.message());
      }
    }

    // Now validate the num recommendations input
    {

      if(!ret->num_recommendations_input_column.empty()) {
        result = validateDescriptionsContainFeatureWithNameAndType(interface.input(),
                                                                   ret->num_recommendations_input_column,
                                                                   {Specification::FeatureType::kInt64Type});
        if(!result.good()) {
          throw std::invalid_argument(result.message());
        }
      }
    }

    // Now test the more advanced item inclusion and exclusion columns.
    {
      std::vector<Specification::FeatureType::TypeCase> allowed_item_input_types =
      { Specification::FeatureType::kSequenceType,
        Specification::FeatureType::kMultiArrayType};

      for(const auto& n : {ret->item_exclusion_input_column, ret->item_restriction_input_column}) {
        if(!n.empty()) {
          result = validateDescriptionsContainFeatureWithNameAndType(interface.input(),
                                                                     n,
                                                                     allowed_item_input_types);

          if(!result.good()) {
            throw std::invalid_argument(result.message());
          }
        }
      }
    }

    // Now validate the num recommendations output
    bool output_column_specified = false;
    if(!ret->item_score_output_column.empty()) {
      result = validateDescriptionsContainFeatureWithNameAndType(interface.output(),
                                                                 ret->item_score_output_column,
                                                                 {Specification::FeatureType::kDictionaryType});
      if(!result.good()) {
        throw std::invalid_argument(result.message());
      }
      output_column_specified = true;
    }

    // Now validate the num recommendations output
    if(!ret->item_list_output_column.empty()) {
      result = validateDescriptionsContainFeatureWithNameAndType(interface.output(),
                                                                 ret->item_list_output_column,
                                                                 {Specification::FeatureType::kSequenceType});
      if(!result.good()) {
        throw std::invalid_argument(result.message());
      }
      output_column_specified = true;
    }

    if(!output_column_specified) {
      throw std::invalid_argument("No output columns specified.");
    }

    return ret;
  }